

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O2

void Qentem::Memory::Sort<true,Qentem::Value<char>,unsigned_int>
               (Value<char> *arr,uint start,uint end)

{
  Value<char> *pVVar1;
  bool bVar2;
  Value<char> *this;
  uint uVar3;
  uint end_00;
  ulong uVar4;
  
LAB_0010b36b:
  if (start == end) {
    return;
  }
  uVar4 = (ulong)start;
  uVar3 = start;
  do {
    pVVar1 = arr + (uVar3 + 1);
    do {
      this = pVVar1;
      uVar3 = uVar3 + 1;
      end_00 = (uint)uVar4;
      if (end <= uVar3) {
        if (end_00 != start) {
          Swap<Qentem::Value<char>>(arr + uVar4,arr + start);
        }
        Sort<true,Qentem::Value<char>,unsigned_int>(arr,start,end_00);
        start = end_00 + 1;
        goto LAB_0010b36b;
      }
      bVar2 = Value<char>::operator<(this,arr + start);
      pVVar1 = this + 1;
    } while (!bVar2);
    uVar4 = (ulong)(end_00 + 1);
    Swap<Qentem::Value<char>>(arr + uVar4,this);
  } while( true );
}

Assistant:

inline static void Sort(Type_T *arr, Number_T start, Number_T end) noexcept {
    if (start != end) {
        Type_T  &item   = arr[start];
        Number_T index  = start;
        Number_T offset = (start + Number_T{1});

        while (offset < end) {
            if (Ascend_T) {
                if (arr[offset] < item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            } else {
                if (arr[offset] > item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            }

            ++offset;
        }

        if (index != start) {
            Swap(arr[index], arr[start]);
        }

        Sort<Ascend_T>(arr, start, index);
        ++index;
        Sort<Ascend_T>(arr, index, end);
    }
}